

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ippu_helpers.cpp
# Opt level: O0

void n_e_s::core::PrintTo(PpuRegisters *r,ostream *os)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  args_3;
  ostream *args_2;
  ostream *args_4;
  format_args args;
  string_view fmt;
  unsigned_short local_400;
  unsigned_short local_3fe;
  uchar local_3fb;
  uchar local_3fa;
  uchar local_3f9;
  v8 *local_3f8;
  char *local_3f0;
  string local_3e8;
  ostream *local_3c8;
  ostream *os_local;
  PpuRegisters *r_local;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> local_138;
  v8 *local_128;
  char *local_120;
  ostream *local_118;
  ostream *local_110;
  ostream *local_108;
  ostream *local_100;
  ostream *local_f8;
  ostream *local_f0;
  ostream *local_e8;
  ostream *local_e0;
  ostream *local_d8;
  ostream *local_d0;
  ostream *local_c8;
  unsigned_short *local_c0;
  unsigned_short *local_b8;
  uchar *local_b0;
  ostream *local_a8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_a0;
  ostream *local_98;
  unsigned_short *local_90;
  PpuRegisters *local_88;
  uint16_t *local_80;
  v8 *local_78;
  char *pcStack_70;
  string *local_68;
  v8 **local_60;
  v8 *local_58;
  char *pcStack_50;
  format_arg *local_48;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_40;
  format_arg *local_38;
  
  local_3f8 = (v8 *)0x302054;
  local_3f0 = (char *)0x121;
  local_3c8 = os;
  os_local = (ostream *)r;
  local_3f9 = Register<unsigned_char>::value(&r->ctrl);
  args_2 = os_local + 8;
  local_3fa = Register<unsigned_char>::value((Register<unsigned_char> *)(os_local + 5));
  args_4 = os_local + 7;
  local_3fb = Register<unsigned_char>::value((Register<unsigned_char> *)(os_local + 6));
  local_3fe = Register<unsigned_short>::value((Register<unsigned_short> *)(os_local + 10));
  local_400 = Register<unsigned_short>::value((Register<unsigned_short> *)(os_local + 0xc));
  local_c8 = os_local + 0xe;
  local_d0 = os_local + 0xf;
  local_d8 = os_local + 0x11;
  local_e0 = os_local + 0x10;
  local_e8 = os_local + 0x16;
  local_f0 = os_local + 0x13;
  local_f8 = os_local + 0x14;
  local_100 = os_local + 0x12;
  local_108 = os_local + 0x1a;
  local_110 = os_local + 0x1c;
  local_118 = os_local + 0x18;
  local_78 = local_3f8;
  pcStack_70 = local_3f0;
  local_90 = (unsigned_short *)&local_3f9;
  args_3.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_3fa;
  local_b0 = &local_3fb;
  local_b8 = &local_3fe;
  local_c0 = &local_400;
  local_60 = &local_78;
  local_128 = local_3f8;
  local_120 = local_3f0;
  local_a8 = args_4;
  local_a0.values_ = args_3.values_;
  local_98 = args_2;
  local_88 = r;
  local_80 = &r->cycle;
  local_68 = &local_3e8;
  local_58 = local_128;
  pcStack_50 = local_120;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short_const&,unsigned_short_const&,unsigned_char&,unsigned_char_const&,unsigned_char&,unsigned_char_const&,unsigned_char&,unsigned_short&,unsigned_short&,bool_const&,bool_const&,unsigned_char_const&,unsigned_char_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_char_const&,unsigned_short_const&,unsigned_short_const&,unsigned_char_const&>
            ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short,_unsigned_short,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_short,_bool,_bool,_unsigned_char,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_char,_unsigned_short,_unsigned_short,_unsigned_char>
              *)&r_local,(v8 *)&r->cycle,&r->scanline,local_90,(uchar *)args_2,
             (uchar *)args_3.values_,(uchar *)args_4,local_b0,(uchar *)local_b8,local_c0,
             (unsigned_short *)local_c8,(bool *)local_d0,(bool *)local_d8,(uchar *)local_e0,
             (uchar *)local_e8,(unsigned_short *)local_f0,(uchar *)local_f8,
             (unsigned_short *)local_100,(uchar *)local_108,(unsigned_short *)local_110,
             (unsigned_short *)local_118,(uchar *)os_local);
  local_40 = &local_138;
  local_48 = (format_arg *)&r_local;
  local_38 = (format_arg *)&r_local;
  ::fmt::v8::basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>::
  basic_format_args(local_40,0x8000000000000014,(format_arg *)&r_local);
  args.field_1.values_ = args_3.values_;
  args.desc_ = (unsigned_long_long)local_138.field_1.values_;
  fmt.size_ = local_138.desc_;
  fmt.data_ = local_120;
  ::fmt::v8::vformat_abi_cxx11_(&local_3e8,local_128,fmt,args);
  std::operator<<(os,(string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  return;
}

Assistant:

void PrintTo(const PpuRegisters &r, std::ostream *os) {
    *os << fmt::format(
            "Cycle: {} Scanline: {} Ctrl: {:#04x} ScrollX: {:#04x} Mask: "
            "{:#04x} OamAddr: {:#04x} "
            "Status: {:#04x} VramAddr: {:#06x} TmpVramAddr: {:#06x} "
            "WriteToggle: {} OddFrame: {} NameTbl: {:#04x}[{:#04x}] "
            "PatternTblHi: {:#06x}[{:#04x}] "
            "PatternTblLow: {:#06x}[{:#04x}] "
            "Attr: {:#06x}:{:#06x}[{:#04x}]\n",
            r.cycle,
            r.scanline,
            r.ctrl.value(),
            r.fine_x_scroll,
            r.mask.value(),
            r.oamaddr,
            r.status.value(),
            r.vram_addr.value(),
            r.temp_vram_addr.value(),
            r.write_toggle,
            r.odd_frame,
            r.name_table,
            r.name_table_latch,
            r.pattern_table_shifter_hi,
            r.pattern_table_latch_hi,
            r.pattern_table_shifter_low,
            r.pattern_table_latch_low,
            r.attribute_table_shifter_low,
            r.attribute_table_shifter_hi,
            r.attribute_table_latch);
}